

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnp.cpp
# Opt level: O0

void __thiscall libtorrent::upnp::next(upnp *this,rootdevice *d,port_mapping_t i)

{
  rootdevice *prVar1;
  bool bVar2;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> v;
  difference_type dVar3;
  __normal_iterator<libtorrent::upnp::mapping_t_*,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
  local_68;
  port_mapping_t local_5c;
  __normal_iterator<libtorrent::upnp::mapping_t_*,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
  local_58 [2];
  mapping_t *local_48;
  mapping_t *local_40;
  __normal_iterator<libtorrent::upnp::mapping_t_*,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
  local_38;
  __normal_iterator<libtorrent::upnp::mapping_t_*,_std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>_>
  j;
  strong_typedef<int,_libtorrent::port_mapping_tag,_void> local_24;
  rootdevice *local_20;
  rootdevice *d_local;
  upnp *this_local;
  port_mapping_t i_local;
  
  local_20 = d;
  d_local = (rootdevice *)this;
  this_local._4_4_ = i.m_val;
  v = libtorrent::aux::
      container_wrapper<libtorrent::upnp::global_mapping_t,_libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>,_std::vector<libtorrent::upnp::global_mapping_t,_std::allocator<libtorrent::upnp::global_mapping_t>_>_>
      ::end_index(&this->m_mappings);
  local_24 = libtorrent::aux::prev<int,libtorrent::port_mapping_tag>(v);
  bVar2 = libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::operator<
                    ((strong_typedef<int,_libtorrent::port_mapping_tag,_void> *)
                     ((long)&this_local + 4),&local_24);
  prVar1 = local_20;
  if (bVar2) {
    j._M_current._0_4_ = this_local._4_4_;
    j._M_current._4_4_ = libtorrent::aux::next<int,libtorrent::port_mapping_tag>(this_local._4_4_);
    update_map(this,prVar1,(port_mapping_t)j._M_current._4_4_);
  }
  else {
    local_40 = (mapping_t *)
               ::std::
               vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>::
               begin(&(local_20->mapping).
                      super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                    );
    local_48 = (mapping_t *)
               ::std::
               vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>::
               end(&(local_20->mapping).
                    super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                  );
    local_38 = ::std::
               find_if<__gnu_cxx::__normal_iterator<libtorrent::upnp::mapping_t*,std::vector<libtorrent::upnp::mapping_t,std::allocator<libtorrent::upnp::mapping_t>>>,libtorrent::upnp::next(libtorrent::upnp::rootdevice&,libtorrent::aux::strong_typedef<int,libtorrent::port_mapping_tag,void>)::__0>
                         (local_40,local_48);
    local_58[0]._M_current =
         (mapping_t *)
         ::std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>::
         end(&(local_20->mapping).
              super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
            );
    bVar2 = __gnu_cxx::operator==(&local_38,local_58);
    prVar1 = local_20;
    if (!bVar2) {
      local_68._M_current =
           (mapping_t *)
           ::std::vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
           ::begin(&(local_20->mapping).
                    super_vector<libtorrent::upnp::mapping_t,_std::allocator<libtorrent::upnp::mapping_t>_>
                  );
      dVar3 = __gnu_cxx::operator-(&local_38,&local_68);
      libtorrent::aux::strong_typedef<int,_libtorrent::port_mapping_tag,_void>::strong_typedef
                (&local_5c,(int)dVar3);
      update_map(this,prVar1,local_5c);
    }
  }
  return;
}

Assistant:

void upnp::next(rootdevice& d, port_mapping_t const i)
{
	TORRENT_ASSERT(is_single_thread());
	TORRENT_ASSERT(!d.disabled);
	if (i < prev(m_mappings.end_index()))
	{
		update_map(d, lt::next(i));
	}
	else
	{
		auto const j = std::find_if(d.mapping.begin(), d.mapping.end()
			, [](mapping_t const& m) { return m.act != portmap_action::none; });
		if (j == d.mapping.end()) return;

		update_map(d, port_mapping_t{static_cast<int>(j - d.mapping.begin())});
	}
}